

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 *in_RDI;
  size_t message_size;
  size_t our_size;
  int in_stack_000001bc;
  Extension *in_stack_000001c0;
  long local_28;
  size_t local_8;
  
  if ((*(char *)(in_RDI + 1) == '\v') && ((*(byte *)((long)in_RDI + 9) & 1) == 0)) {
    if ((*(byte *)((long)in_RDI + 10) & 1) == 0) {
      sVar1 = io::CodedOutputStream::VarintSize32(0);
      if ((*(byte *)((long)in_RDI + 10) >> 4 & 1) == 0) {
        local_28 = (**(code **)(*(long *)*in_RDI + 0x58))();
      }
      else {
        local_28 = (**(code **)(*(long *)*in_RDI + 0x58))();
      }
      sVar2 = io::CodedOutputStream::VarintSize32(0);
      local_8 = local_28 + sVar2 + sVar1 + 4;
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = ByteSize(in_stack_000001c0,in_stack_000001bc);
  }
  return local_8;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  size_t message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSizeLong();
  } else {
    message_size = message_value->ByteSizeLong();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}